

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
detail::GeneratedMakeCommand::QuotedPrintable_abi_cxx11_
          (string *__return_storage_ptr__,GeneratedMakeCommand *this)

{
  pointer pbVar1;
  int in_R8D;
  pointer pbVar2;
  string_view str;
  char *sep;
  char *local_78;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = "";
  pbVar1 = (this->PrimaryCommand).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->PrimaryCommand).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    str._M_str = (char *)0x100;
    str._M_len = (size_t)(pbVar2->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForShell_abi_cxx11_
              (&local_70,(cmOutputConverter *)pbVar2->_M_string_length,str,in_R8D);
    cmStrCat<char_const*&,std::__cxx11::string>(&local_50,&local_78,&local_70);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    local_78 = " ";
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMakeCommand::QuotedPrintable() const
{
  std::string output;
  const char* sep = "";
  int flags = 0;
#if !defined(_WIN32)
  flags |= cmOutputConverter::Shell_Flag_IsUnix;
#endif
  for (auto const& arg : this->PrimaryCommand) {
    output += cmStrCat(sep, cmOutputConverter::EscapeForShell(arg, flags));
    sep = " ";
  }
  return output;
}